

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O0

bool crnlib::rg_etc1::unpack_etc1_block
               (void *pETC1_block,uint *pDst_pixels_rgba,bool preserve_alpha)

{
  uint uVar1;
  byte in_DL;
  color_quad_u8 *in_RSI;
  etc1_block *in_RDI;
  uint y_5;
  uint y_4;
  uint y_3;
  uint y_2;
  uint y_1;
  uint y;
  uint16 base_color4_1;
  uint16 base_color4_0;
  uint16 delta_color3;
  uint16 base_color5;
  bool success;
  color_quad_u8 subblock_colors1 [4];
  color_quad_u8 subblock_colors0 [4];
  uint table_index1;
  uint table_index0;
  bool flip_flag;
  bool diff_flag;
  etc1_block *block;
  color_quad_u8 *pDst;
  undefined8 in_stack_fffffffffffffef8;
  etc1_block *in_stack_ffffffffffffff00;
  color_quad_u8 *pcVar2;
  undefined8 in_stack_ffffffffffffff18;
  color_quad_u8 *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  color_quad_u8 *in_stack_ffffffffffffff30;
  color_quad_u8 *local_a0;
  color_quad_u8 *local_88;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  uint local_68;
  bool local_59;
  color_quad_u8 local_58 [4];
  color_quad_u8 local_48 [4];
  color_quad_u8 cStack_38;
  uint local_34;
  uint local_30;
  byte local_2a;
  byte local_29;
  etc1_block *local_28;
  color_quad_u8 *local_20;
  byte local_11;
  
  local_11 = in_DL & 1;
  local_28 = in_RDI;
  local_20 = in_RSI;
  local_29 = etc1_block::get_diff_bit(in_RDI);
  local_2a = etc1_block::get_flip_bit(local_28);
  local_30 = etc1_block::get_inten_table(local_28,0);
  local_34 = etc1_block::get_inten_table(local_28,1);
  local_88 = local_48;
  do {
    color_quad_u8::color_quad_u8(local_88);
    local_88 = local_88 + 1;
  } while (local_88 != &cStack_38);
  local_a0 = local_58;
  do {
    color_quad_u8::color_quad_u8(local_a0);
    local_a0 = local_a0 + 1;
  } while (local_a0 != local_48);
  local_59 = true;
  if ((local_29 & 1) == 0) {
    uVar1 = (uint)((ulong)in_stack_fffffffffffffef8 >> 0x20);
    etc1_block::get_base4_color(in_stack_ffffffffffffff00,uVar1);
    etc1_block::get_abs_subblock_colors
              (in_stack_ffffffffffffff20,(uint16)((ulong)in_stack_ffffffffffffff18 >> 0x30),
               (uint)in_stack_ffffffffffffff18);
    etc1_block::get_base4_color(in_stack_ffffffffffffff00,uVar1);
    etc1_block::get_abs_subblock_colors
              (in_stack_ffffffffffffff20,(uint16)((ulong)in_stack_ffffffffffffff18 >> 0x30),
               (uint)in_stack_ffffffffffffff18);
  }
  else {
    etc1_block::get_base5_color(in_stack_ffffffffffffff00);
    etc1_block::get_delta3_color(in_stack_ffffffffffffff00);
    etc1_block::get_diff_subblock_colors
              (in_stack_ffffffffffffff20,(uint16)((ulong)in_stack_ffffffffffffff18 >> 0x30),
               (uint)in_stack_ffffffffffffff18);
    local_59 = etc1_block::get_diff_subblock_colors
                         (in_stack_ffffffffffffff30,
                          (uint16)((ulong)in_stack_ffffffffffffff28 >> 0x30),
                          (uint16)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                          (uint)in_stack_ffffffffffffff28);
  }
  if ((local_11 & 1) == 0) {
    if ((local_2a & 1) == 0) {
      for (local_7c = 0; local_7c < 4; local_7c = local_7c + 1) {
        uVar1 = etc1_block::get_selector(local_28,0,local_7c);
        color_quad_u8::operator=(local_20,local_48 + uVar1);
        uVar1 = etc1_block::get_selector(local_28,1,local_7c);
        color_quad_u8::operator=(local_20 + 1,local_48 + uVar1);
        uVar1 = etc1_block::get_selector(local_28,2,local_7c);
        color_quad_u8::operator=(local_20 + 2,local_58 + uVar1);
        uVar1 = etc1_block::get_selector(local_28,3,local_7c);
        color_quad_u8::operator=(local_20 + 3,local_58 + uVar1);
        local_20 = local_20 + 4;
      }
    }
    else {
      for (local_74 = 0; local_74 < 2; local_74 = local_74 + 1) {
        uVar1 = etc1_block::get_selector(local_28,0,local_74);
        color_quad_u8::operator=(local_20,local_48 + uVar1);
        uVar1 = etc1_block::get_selector(local_28,1,local_74);
        color_quad_u8::operator=(local_20 + 1,local_48 + uVar1);
        uVar1 = etc1_block::get_selector(local_28,2,local_74);
        color_quad_u8::operator=(local_20 + 2,local_48 + uVar1);
        uVar1 = etc1_block::get_selector(local_28,3,local_74);
        color_quad_u8::operator=(local_20 + 3,local_48 + uVar1);
        local_20 = local_20 + 4;
      }
      for (local_78 = 2; local_78 < 4; local_78 = local_78 + 1) {
        uVar1 = etc1_block::get_selector(local_28,0,local_78);
        color_quad_u8::operator=(local_20,local_58 + uVar1);
        uVar1 = etc1_block::get_selector(local_28,1,local_78);
        color_quad_u8::operator=(local_20 + 1,local_58 + uVar1);
        uVar1 = etc1_block::get_selector(local_28,2,local_78);
        color_quad_u8::operator=(local_20 + 2,local_58 + uVar1);
        uVar1 = etc1_block::get_selector(local_28,3,local_78);
        color_quad_u8::operator=(local_20 + 3,local_58 + uVar1);
        local_20 = local_20 + 4;
      }
    }
  }
  else if ((local_2a & 1) == 0) {
    for (local_70 = 0; pcVar2 = local_20, local_70 < 4; local_70 = local_70 + 1) {
      uVar1 = etc1_block::get_selector(local_28,0,local_70);
      color_quad_u8::set_rgb(pcVar2,local_48 + uVar1);
      pcVar2 = local_20 + 1;
      uVar1 = etc1_block::get_selector(local_28,1,local_70);
      color_quad_u8::set_rgb(pcVar2,local_48 + uVar1);
      pcVar2 = local_20 + 2;
      uVar1 = etc1_block::get_selector(local_28,2,local_70);
      color_quad_u8::set_rgb(pcVar2,local_58 + uVar1);
      pcVar2 = local_20 + 3;
      uVar1 = etc1_block::get_selector(local_28,3,local_70);
      color_quad_u8::set_rgb(pcVar2,local_58 + uVar1);
      local_20 = local_20 + 4;
    }
  }
  else {
    for (local_68 = 0; local_68 < 2; local_68 = local_68 + 1) {
      pcVar2 = local_20;
      uVar1 = etc1_block::get_selector(local_28,0,local_68);
      color_quad_u8::set_rgb(pcVar2,local_48 + uVar1);
      pcVar2 = local_20 + 1;
      uVar1 = etc1_block::get_selector(local_28,1,local_68);
      color_quad_u8::set_rgb(pcVar2,local_48 + uVar1);
      pcVar2 = local_20 + 2;
      uVar1 = etc1_block::get_selector(local_28,2,local_68);
      color_quad_u8::set_rgb(pcVar2,local_48 + uVar1);
      pcVar2 = local_20 + 3;
      uVar1 = etc1_block::get_selector(local_28,3,local_68);
      color_quad_u8::set_rgb(pcVar2,local_48 + uVar1);
      local_20 = local_20 + 4;
    }
    for (local_6c = 2; pcVar2 = local_20, local_6c < 4; local_6c = local_6c + 1) {
      uVar1 = etc1_block::get_selector(local_28,0,local_6c);
      color_quad_u8::set_rgb(pcVar2,local_58 + uVar1);
      pcVar2 = local_20 + 1;
      uVar1 = etc1_block::get_selector(local_28,1,local_6c);
      color_quad_u8::set_rgb(pcVar2,local_58 + uVar1);
      pcVar2 = local_20 + 2;
      uVar1 = etc1_block::get_selector(local_28,2,local_6c);
      color_quad_u8::set_rgb(pcVar2,local_58 + uVar1);
      pcVar2 = local_20 + 3;
      uVar1 = etc1_block::get_selector(local_28,3,local_6c);
      color_quad_u8::set_rgb(pcVar2,local_58 + uVar1);
      local_20 = local_20 + 4;
    }
  }
  return local_59;
}

Assistant:

bool unpack_etc1_block(const void* pETC1_block, unsigned int* pDst_pixels_rgba, bool preserve_alpha) {
  color_quad_u8* pDst = reinterpret_cast<color_quad_u8*>(pDst_pixels_rgba);
  const etc1_block& block = *static_cast<const etc1_block*>(pETC1_block);

  const bool diff_flag = block.get_diff_bit();
  const bool flip_flag = block.get_flip_bit();
  const uint table_index0 = block.get_inten_table(0);
  const uint table_index1 = block.get_inten_table(1);

  color_quad_u8 subblock_colors0[4];
  color_quad_u8 subblock_colors1[4];
  bool success = true;

  if (diff_flag) {
    const uint16 base_color5 = block.get_base5_color();
    const uint16 delta_color3 = block.get_delta3_color();
    etc1_block::get_diff_subblock_colors(subblock_colors0, base_color5, table_index0);

    if (!etc1_block::get_diff_subblock_colors(subblock_colors1, base_color5, delta_color3, table_index1))
      success = false;
  } else {
    const uint16 base_color4_0 = block.get_base4_color(0);
    etc1_block::get_abs_subblock_colors(subblock_colors0, base_color4_0, table_index0);

    const uint16 base_color4_1 = block.get_base4_color(1);
    etc1_block::get_abs_subblock_colors(subblock_colors1, base_color4_1, table_index1);
  }

  if (preserve_alpha) {
    if (flip_flag) {
      for (uint y = 0; y < 2; y++) {
        pDst[0].set_rgb(subblock_colors0[block.get_selector(0, y)]);
        pDst[1].set_rgb(subblock_colors0[block.get_selector(1, y)]);
        pDst[2].set_rgb(subblock_colors0[block.get_selector(2, y)]);
        pDst[3].set_rgb(subblock_colors0[block.get_selector(3, y)]);
        pDst += 4;
      }

      for (uint y = 2; y < 4; y++) {
        pDst[0].set_rgb(subblock_colors1[block.get_selector(0, y)]);
        pDst[1].set_rgb(subblock_colors1[block.get_selector(1, y)]);
        pDst[2].set_rgb(subblock_colors1[block.get_selector(2, y)]);
        pDst[3].set_rgb(subblock_colors1[block.get_selector(3, y)]);
        pDst += 4;
      }
    } else {
      for (uint y = 0; y < 4; y++) {
        pDst[0].set_rgb(subblock_colors0[block.get_selector(0, y)]);
        pDst[1].set_rgb(subblock_colors0[block.get_selector(1, y)]);
        pDst[2].set_rgb(subblock_colors1[block.get_selector(2, y)]);
        pDst[3].set_rgb(subblock_colors1[block.get_selector(3, y)]);
        pDst += 4;
      }
    }
  } else {
    if (flip_flag) {
      // 0000
      // 0000
      // 1111
      // 1111
      for (uint y = 0; y < 2; y++) {
        pDst[0] = subblock_colors0[block.get_selector(0, y)];
        pDst[1] = subblock_colors0[block.get_selector(1, y)];
        pDst[2] = subblock_colors0[block.get_selector(2, y)];
        pDst[3] = subblock_colors0[block.get_selector(3, y)];
        pDst += 4;
      }

      for (uint y = 2; y < 4; y++) {
        pDst[0] = subblock_colors1[block.get_selector(0, y)];
        pDst[1] = subblock_colors1[block.get_selector(1, y)];
        pDst[2] = subblock_colors1[block.get_selector(2, y)];
        pDst[3] = subblock_colors1[block.get_selector(3, y)];
        pDst += 4;
      }
    } else {
      // 0011
      // 0011
      // 0011
      // 0011
      for (uint y = 0; y < 4; y++) {
        pDst[0] = subblock_colors0[block.get_selector(0, y)];
        pDst[1] = subblock_colors0[block.get_selector(1, y)];
        pDst[2] = subblock_colors1[block.get_selector(2, y)];
        pDst[3] = subblock_colors1[block.get_selector(3, y)];
        pDst += 4;
      }
    }
  }

  return success;
}